

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O2

void __thiscall
pbrt::WeightedReservoirSampler<pbrt::LightHandle>::Add
          (WeightedReservoirSampler<pbrt::LightHandle> *this,LightHandle *sample,Float weight)

{
  float fVar1;
  float fVar2;
  
  fVar1 = weight + this->weightSum;
  this->weightSum = fVar1;
  fVar2 = RNG::Uniform<float>(&this->rng);
  if (fVar2 < weight / fVar1) {
    (this->reservoir).
    super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
    .bits = (sample->
            super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
            ).bits;
    this->reservoirWeight = weight;
  }
  return;
}

Assistant:

PBRT_CPU_GPU
    void Add(const T &sample, Float weight) {
        weightSum += weight;
        // Randomly add _sample_ to reservoir
        Float p = weight / weightSum;
        if (rng.Uniform<Float>() < p) {
            reservoir = sample;
            reservoirWeight = weight;
        }

        DCHECK_LT(weightSum, 1e80);
    }